

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

bool __thiscall Symbol::GetIsCommittedToSlot(Symbol *this)

{
  bool bVar1;
  FuncInfo *pFVar2;
  bool local_21;
  Symbol *this_local;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01eb5b30,DelayCapturePhase);
  if (bVar1) {
    local_21 = true;
    if (((byte)((ushort)*(undefined2 *)&this->field_0x42 >> 10) & 1) == 0) {
      pFVar2 = Scope::GetFunc(this->scope);
      bVar1 = FuncInfo::GetCallsEval(pFVar2);
      local_21 = true;
      if (!bVar1) {
        pFVar2 = Scope::GetFunc(this->scope);
        local_21 = FuncInfo::GetChildCallsEval(pFVar2);
      }
    }
    this_local._7_1_ = local_21;
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Symbol::GetIsCommittedToSlot() const
{
    if (!PHASE_ON1(Js::DelayCapturePhase))
    {
        return true;
    }
    return isCommittedToSlot || this->scope->GetFunc()->GetCallsEval() || this->scope->GetFunc()->GetChildCallsEval();
}